

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsa.c
# Opt level: O0

int mbedtls_rsa_rsassa_pss_sign
              (mbedtls_rsa_context *ctx,_func_int_void_ptr_uchar_ptr_size_t *f_rng,void *p_rng,
              int mode,mbedtls_md_type_t md_alg,uint hashlen,uchar *hash,uchar *sig)

{
  ulong __n;
  byte bVar1;
  uint uVar2;
  int iVar3;
  size_t sVar4;
  undefined1 *puVar5;
  int local_c4;
  undefined1 local_c0 [8];
  mbedtls_md_context_t md_ctx;
  mbedtls_md_info_t *md_info;
  size_t msb;
  int ret;
  uint offset;
  uint hlen;
  uint slen;
  uchar salt [64];
  uchar *p;
  size_t olen;
  uint hashlen_local;
  mbedtls_md_type_t md_alg_local;
  int mode_local;
  void *p_rng_local;
  _func_int_void_ptr_uchar_ptr_size_t *f_rng_local;
  mbedtls_rsa_context *ctx_local;
  
  salt._56_8_ = sig;
  if ((mode == 1) && (ctx->padding != 1)) {
    ctx_local._4_4_ = -0x4080;
  }
  else if (f_rng == (_func_int_void_ptr_uchar_ptr_size_t *)0x0) {
    ctx_local._4_4_ = -0x4080;
  }
  else {
    __n = ctx->len;
    olen._4_4_ = hashlen;
    if (md_alg != MBEDTLS_MD_NONE) {
      md_ctx.hmac_ctx = mbedtls_md_info_from_type(md_alg);
      if ((mbedtls_md_info_t *)md_ctx.hmac_ctx == (mbedtls_md_info_t *)0x0) {
        return -0x4080;
      }
      bVar1 = mbedtls_md_get_size((mbedtls_md_info_t *)md_ctx.hmac_ctx);
      olen._4_4_ = (uint)bVar1;
    }
    md_ctx.hmac_ctx = mbedtls_md_info_from_type(ctx->hash_id);
    if ((mbedtls_md_info_t *)md_ctx.hmac_ctx == (mbedtls_md_info_t *)0x0) {
      ctx_local._4_4_ = -0x4080;
    }
    else {
      bVar1 = mbedtls_md_get_size((mbedtls_md_info_t *)md_ctx.hmac_ctx);
      uVar2 = (uint)bVar1;
      if (__n < uVar2 * 2 + 2) {
        ctx_local._4_4_ = -0x4080;
      }
      else {
        memset(sig,0,__n);
        iVar3 = (*f_rng)(p_rng,(uchar *)&hlen,(ulong)bVar1);
        if (iVar3 == 0) {
          sVar4 = mbedtls_mpi_bitlen(&ctx->N);
          puVar5 = (undefined1 *)(__n + (ulong)bVar1 * -2 + -2 + salt._56_8_);
          salt._56_8_ = puVar5 + 1;
          *puVar5 = 1;
          memcpy((void *)salt._56_8_,&hlen,(ulong)uVar2);
          salt._56_8_ = salt._56_8_ + (ulong)uVar2;
          mbedtls_md_init((mbedtls_md_context_t *)local_c0);
          ctx_local._4_4_ =
               mbedtls_md_setup((mbedtls_md_context_t *)local_c0,
                                (mbedtls_md_info_t *)md_ctx.hmac_ctx,0);
          if (ctx_local._4_4_ == 0) {
            mbedtls_md_starts((mbedtls_md_context_t *)local_c0);
            mbedtls_md_update((mbedtls_md_context_t *)local_c0,(uchar *)salt._56_8_,8);
            mbedtls_md_update((mbedtls_md_context_t *)local_c0,hash,(ulong)olen._4_4_);
            mbedtls_md_update((mbedtls_md_context_t *)local_c0,(uchar *)&hlen,(ulong)uVar2);
            mbedtls_md_finish((mbedtls_md_context_t *)local_c0,(uchar *)salt._56_8_);
            msb._4_4_ = (uint)((sVar4 - 1 & 7) == 0);
            mgf_mask(sig + msb._4_4_,((__n - uVar2) + -1) - (ulong)msb._4_4_,(uchar *)salt._56_8_,
                     (ulong)uVar2,(mbedtls_md_context_t *)local_c0);
            mbedtls_md_free((mbedtls_md_context_t *)local_c0);
            sVar4 = mbedtls_mpi_bitlen(&ctx->N);
            *sig = *sig & (byte)(0xff >> ((char)(__n << 3) - ((char)sVar4 + -1) & 0x1fU));
            puVar5 = (undefined1 *)(salt._56_8_ + (ulong)uVar2);
            salt._56_8_ = puVar5 + 1;
            *puVar5 = 0xbc;
            if (mode == 0) {
              local_c4 = mbedtls_rsa_public(ctx,sig,sig);
            }
            else {
              local_c4 = mbedtls_rsa_private(ctx,f_rng,p_rng,sig,sig);
            }
            ctx_local._4_4_ = local_c4;
          }
          else {
            mbedtls_md_free((mbedtls_md_context_t *)local_c0);
          }
        }
        else {
          ctx_local._4_4_ = iVar3 + -0x4480;
        }
      }
    }
  }
  return ctx_local._4_4_;
}

Assistant:

int mbedtls_rsa_rsassa_pss_sign( mbedtls_rsa_context *ctx,
                         int (*f_rng)(void *, unsigned char *, size_t),
                         void *p_rng,
                         int mode,
                         mbedtls_md_type_t md_alg,
                         unsigned int hashlen,
                         const unsigned char *hash,
                         unsigned char *sig )
{
    size_t olen;
    unsigned char *p = sig;
    unsigned char salt[MBEDTLS_MD_MAX_SIZE];
    unsigned int slen, hlen, offset = 0;
    int ret;
    size_t msb;
    const mbedtls_md_info_t *md_info;
    mbedtls_md_context_t md_ctx;

    if( mode == MBEDTLS_RSA_PRIVATE && ctx->padding != MBEDTLS_RSA_PKCS_V21 )
        return( MBEDTLS_ERR_RSA_BAD_INPUT_DATA );

    if( f_rng == NULL )
        return( MBEDTLS_ERR_RSA_BAD_INPUT_DATA );

    olen = ctx->len;

    if( md_alg != MBEDTLS_MD_NONE )
    {
        /* Gather length of hash to sign */
        md_info = mbedtls_md_info_from_type( md_alg );
        if( md_info == NULL )
            return( MBEDTLS_ERR_RSA_BAD_INPUT_DATA );

        hashlen = mbedtls_md_get_size( md_info );
    }

    md_info = mbedtls_md_info_from_type( (mbedtls_md_type_t) ctx->hash_id );
    if( md_info == NULL )
        return( MBEDTLS_ERR_RSA_BAD_INPUT_DATA );

    hlen = mbedtls_md_get_size( md_info );
    slen = hlen;

    if( olen < hlen + slen + 2 )
        return( MBEDTLS_ERR_RSA_BAD_INPUT_DATA );

    memset( sig, 0, olen );

    /* Generate salt of length slen */
    if( ( ret = f_rng( p_rng, salt, slen ) ) != 0 )
        return( MBEDTLS_ERR_RSA_RNG_FAILED + ret );

    /* Note: EMSA-PSS encoding is over the length of N - 1 bits */
    msb = mbedtls_mpi_bitlen( &ctx->N ) - 1;
    p += olen - hlen * 2 - 2;
    *p++ = 0x01;
    memcpy( p, salt, slen );
    p += slen;

    mbedtls_md_init( &md_ctx );
    if( ( ret = mbedtls_md_setup( &md_ctx, md_info, 0 ) ) != 0 )
    {
        mbedtls_md_free( &md_ctx );
        return( ret );
    }

    /* Generate H = Hash( M' ) */
    mbedtls_md_starts( &md_ctx );
    mbedtls_md_update( &md_ctx, p, 8 );
    mbedtls_md_update( &md_ctx, hash, hashlen );
    mbedtls_md_update( &md_ctx, salt, slen );
    mbedtls_md_finish( &md_ctx, p );

    /* Compensate for boundary condition when applying mask */
    if( msb % 8 == 0 )
        offset = 1;

    /* maskedDB: Apply dbMask to DB */
    mgf_mask( sig + offset, olen - hlen - 1 - offset, p, hlen, &md_ctx );

    mbedtls_md_free( &md_ctx );

    msb = mbedtls_mpi_bitlen( &ctx->N ) - 1;
    sig[0] &= 0xFF >> ( olen * 8 - msb );

    p += hlen;
    *p++ = 0xBC;

    return( ( mode == MBEDTLS_RSA_PUBLIC )
            ? mbedtls_rsa_public(  ctx, sig, sig )
            : mbedtls_rsa_private( ctx, f_rng, p_rng, sig, sig ) );
}